

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto2Proto3EnumFeatures_Test::TestBody
          (FeaturesTest_Proto2Proto3EnumFeatures_Test *this)

{
  int iVar1;
  FieldDescriptor *this_00;
  bool bVar2;
  FileDescriptor *this_01;
  FileDescriptor *pFVar3;
  undefined8 extraout_RAX;
  char *in_R9;
  string_view file_text;
  string_view file_text_00;
  Metadata MVar4;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined1 local_30 [32];
  
  MVar4 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar4.descriptor)->file_);
  MVar4 = pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar4.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo3.proto\"\n    syntax: \"proto3\"\n    enum_type {\n      name: \"Enum3\"\n      value { name: \"DEFAULT_ENUM3\" number: 0 }\n      value { name: \"BAR_ENUM3\" number: 1 }\n    }\n    message_type {\n      name: \"Message3\"\n      field {\n        name: \"enum_field\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_ENUM\n        type_name: \".Enum3\"\n      }\n    }\n  "
  ;
  file_text._M_len = 0x17a;
  this_01 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  file_text_00._M_str =
       "\n    name: \"foo2.proto\"\n    dependency: \"foo3.proto\"\n    enum_type {\n      name: \"Enum2\"\n      value { name: \"DEFAULT_ENUM2\" number: 0 }\n      value { name: \"BAR_ENUM2\" number: 1 }\n    }\n    message_type {\n      name: \"Message2\"\n      field {\n        name: \"enum_field2\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_ENUM\n        type_name: \".Enum2\"\n      }\n      field {\n        name: \"enum_field3\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_ENUM\n        type_name: \".Enum3\"\n      }\n    }\n  "
  ;
  file_text_00._M_len = 0x219;
  pFVar3 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text_00);
  if (pFVar3->message_type_count_ < 1) {
    TestBody();
LAB_005b6f8a:
    TestBody();
LAB_005b6f94:
    TestBody();
  }
  else {
    if (this_01->message_type_count_ < 1) goto LAB_005b6f8a;
    if (this_01->message_types_->field_count_ < 1) goto LAB_005b6f94;
    iVar1 = pFVar3->message_types_->field_count_;
    if (0 < iVar1) {
      if (iVar1 != 1) {
        this_00 = pFVar3->message_types_->fields_;
        bVar2 = FieldDescriptor::legacy_enum_field_treated_as_closed
                          (this_01->message_types_->fields_);
        local_40[0] = (internal)!bVar2;
        local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_30,local_40,
                     (AssertionResult *)"field_proto3->legacy_enum_field_treated_as_closed()","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2117,(char *)local_30._0_8_);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((undefined1 *)local_30._0_8_ != local_30 + 0x10) {
            operator_delete((void *)local_30._0_8_,local_30._16_8_ + 1);
          }
          if (local_48._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_48._M_head_impl + 8))();
          }
          if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_38,local_38);
          }
        }
        local_40[0] = (internal)FieldDescriptor::legacy_enum_field_treated_as_closed(this_00);
        local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_30,local_40,
                     (AssertionResult *)"field_proto2_closed->legacy_enum_field_treated_as_closed()"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2118,(char *)local_30._0_8_);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((undefined1 *)local_30._0_8_ != local_30 + 0x10) {
            operator_delete((void *)local_30._0_8_,local_30._16_8_ + 1);
          }
          if (local_48._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_48._M_head_impl + 8))();
          }
          if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_38,local_38);
          }
        }
        local_40[0] = (internal)FieldDescriptor::legacy_enum_field_treated_as_closed(this_00 + 1);
        local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_30,local_40,
                     (AssertionResult *)"field_proto2_open->legacy_enum_field_treated_as_closed()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2119,(char *)local_30._0_8_);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((undefined1 *)local_30._0_8_ != local_30 + 0x10) {
            operator_delete((void *)local_30._0_8_,local_30._16_8_ + 1);
          }
          if (local_48._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_48._M_head_impl + 8))();
          }
          if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_38,local_38);
          }
        }
        return;
      }
      goto LAB_005b6fa8;
    }
  }
  TestBody();
LAB_005b6fa8:
  TestBody((FeaturesTest_Proto2Proto3EnumFeatures_Test *)local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((undefined1 *)local_30._0_8_ != local_30 + 0x10) {
    operator_delete((void *)local_30._0_8_,local_30._16_8_ + 1);
  }
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_01,local_38);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, Proto2Proto3EnumFeatures) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file_proto3 = BuildFile(R"pb(
    name: "foo3.proto"
    syntax: "proto3"
    enum_type {
      name: "Enum3"
      value { name: "DEFAULT_ENUM3" number: 0 }
      value { name: "BAR_ENUM3" number: 1 }
    }
    message_type {
      name: "Message3"
      field {
        name: "enum_field"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_ENUM
        type_name: ".Enum3"
      }
    }
  )pb");
  const FileDescriptor* file_proto2 = BuildFile(R"pb(
    name: "foo2.proto"
    dependency: "foo3.proto"
    enum_type {
      name: "Enum2"
      value { name: "DEFAULT_ENUM2" number: 0 }
      value { name: "BAR_ENUM2" number: 1 }
    }
    message_type {
      name: "Message2"
      field {
        name: "enum_field2"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_ENUM
        type_name: ".Enum2"
      }
      field {
        name: "enum_field3"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_ENUM
        type_name: ".Enum3"
      }
    }
  )pb");
  const Descriptor* message_proto2 = file_proto2->message_type(0);
  const Descriptor* message_proto3 = file_proto3->message_type(0);
  const FieldDescriptor* field_proto3 = message_proto3->field(0);
  const FieldDescriptor* field_proto2_closed = message_proto2->field(0);
  const FieldDescriptor* field_proto2_open = message_proto2->field(1);

  EXPECT_FALSE(field_proto3->legacy_enum_field_treated_as_closed());
  EXPECT_TRUE(field_proto2_closed->legacy_enum_field_treated_as_closed());
  EXPECT_TRUE(field_proto2_open->legacy_enum_field_treated_as_closed());
}